

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

int jrtplib::GetIPv4SocketPort(SocketType s,uint16_t *pPort)

{
  int iVar1;
  socklen_t local_38;
  int local_34;
  uint length;
  int type;
  undefined1 local_28 [2];
  uint16_t port;
  uint size;
  sockaddr_in addr;
  uint16_t *pPort_local;
  SocketType s_local;
  
  addr.sin_zero = (uchar  [8])pPort;
  if (pPort != (uint16_t *)0x0) {
    memset(local_28,0,0x10);
    type = 0x10;
    iVar1 = getsockname(s,(sockaddr *)local_28,(socklen_t *)&type);
    if (iVar1 == 0) {
      if (local_28 == (undefined1  [2])0x2) {
        length._2_2_ = ntohs(port);
        if (length._2_2_ == 0) {
          pPort_local._4_4_ = -0x9d;
        }
        else {
          local_34 = 0;
          local_38 = 4;
          iVar1 = getsockopt(s,1,3,&local_34,&local_38);
          if (iVar1 == 0) {
            if (local_34 == 2) {
              *(uint16_t *)addr.sin_zero = length._2_2_;
              pPort_local._4_4_ = 0;
            }
            else {
              pPort_local._4_4_ = -0x9f;
            }
          }
          else {
            pPort_local._4_4_ = -0x9e;
          }
        }
      }
      else {
        pPort_local._4_4_ = -0x9c;
      }
    }
    else {
      pPort_local._4_4_ = -0x9b;
    }
    return pPort_local._4_4_;
  }
  __assert_fail("pPort != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fcsl[P]jrtplib-3/src/rtpudpv4transmitter.cpp"
                ,0x88,"int jrtplib::GetIPv4SocketPort(SocketType, uint16_t *)");
}

Assistant:

static int GetIPv4SocketPort(SocketType s, uint16_t *pPort)
{
	assert(pPort != 0);

	struct sockaddr_in addr;
	memset(&addr, 0, sizeof(struct sockaddr_in));

	RTPSOCKLENTYPE size = sizeof(struct sockaddr_in);
	if (getsockname(s,(struct sockaddr*)&addr,&size) != 0)
		return ERR_RTP_UDPV4TRANS_CANTGETSOCKETPORT;

	if (addr.sin_family != AF_INET)
		return ERR_RTP_UDPV4TRANS_NOTANIPV4SOCKET;

	uint16_t port = ntohs(addr.sin_port);
	if (port == 0)
		return ERR_RTP_UDPV4TRANS_SOCKETPORTNOTSET;
	
	int type = 0;
	RTPSOCKLENTYPE length = sizeof(type);

	if (getsockopt(s, SOL_SOCKET, SO_TYPE, (char*)&type, &length) != 0)
		return ERR_RTP_UDPV4TRANS_CANTGETSOCKETTYPE;

	if (type != SOCK_DGRAM)
		return ERR_RTP_UDPV4TRANS_INVALIDSOCKETTYPE;

	*pPort = port;
	return 0;
}